

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doublingfactorcounter_test.cpp
# Opt level: O2

void __thiscall
TEST_DoublingFactorCounterTest_AllTerminalsAndHornors_AllTriplets_Test::
TEST_DoublingFactorCounterTest_AllTerminalsAndHornors_AllTriplets_Test
          (TEST_DoublingFactorCounterTest_AllTerminalsAndHornors_AllTriplets_Test *this)

{
  memset(this,0,0xc0);
  TEST_GROUP_CppUTestGroupDoublingFactorCounterTest::
  TEST_GROUP_CppUTestGroupDoublingFactorCounterTest
            (&this->super_TEST_GROUP_CppUTestGroupDoublingFactorCounterTest);
  (this->super_TEST_GROUP_CppUTestGroupDoublingFactorCounterTest).super_Utest._vptr_Utest =
       (_func_int **)&PTR__TEST_GROUP_CppUTestGroupDoublingFactorCounterTest_001d5380;
  return;
}

Assistant:

TEST(DoublingFactorCounterTest, AllTerminalsAndHornors_AllTriplets)
{
	addPair(Tile::WestWind);
	addTriplet(Tile::NorthWind, true);
	addTriplet(Tile::OneOfCharacters, true);
	addTriplet(Tile::NineOfCircles, false);
	addTriplet(Tile::NineOfBamboos, false);

	s.selfDrawn();
	auto r = c.report();

	CHECK_EQUAL(1, r.patterns.count(Pattern::AllTerminalsAndHornors));
	CHECK_EQUAL(1, r.patterns.count(Pattern::AllTriplets));
	CHECK_EQUAL(0, r.patterns.count(Pattern::TerminalOrHonorInEachSet));
	CHECK_EQUAL(4, r.doubling_factor);
}